

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeBuilders.cpp
# Opt level: O0

bool __thiscall
Opcode::AABBTreeOfVerticesBuilder::ComputeGlobalBox
          (AABBTreeOfVerticesBuilder *this,udword *primitives,udword nb_prims,AABB *global_box)

{
  uint local_34;
  udword i;
  AABB *global_box_local;
  udword nb_prims_local;
  udword *primitives_local;
  AABBTreeOfVerticesBuilder *this_local;
  
  if ((primitives == (udword *)0x0) || (nb_prims == 0)) {
    this_local._7_1_ = false;
  }
  else {
    IceMaths::AABB::SetEmpty(global_box);
    for (local_34 = 0; local_34 < nb_prims; local_34 = local_34 + 1) {
      IceMaths::AABB::Extend(global_box,this->mVertexArray + primitives[local_34]);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AABBTreeOfVerticesBuilder::ComputeGlobalBox(const udword* primitives, udword nb_prims, AABB& global_box) const
{
	// Checkings
	if(!primitives || !nb_prims)	return false;

	// Initialize global box
	global_box.SetEmpty();

	// Loop through vertices
	for(udword i=0;i<nb_prims;i++)
	{
		// Update global box
		global_box.Extend(mVertexArray[primitives[i]]);
	}
	return true;
}